

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_sorter.cpp
# Opt level: O1

void __thiscall duckdb::MergeSorter::MergeRadix(MergeSorter *this,idx_t *count,bool *left_smaller)

{
  idx_t *l_entry_idx;
  idx_t *r_entry_idx;
  SortedBlock *this_00;
  SortedBlock *pSVar1;
  _Head_base<0UL,_duckdb::RowDataBlock_*,_false> target_block;
  idx_t iVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  size_type __n;
  pointer puVar4;
  pointer puVar5;
  _Head_base<0UL,_duckdb::RowDataBlock_*,_false> _Var6;
  idx_t iVar7;
  idx_t iVar8;
  idx_t iVar9;
  idx_t iVar10;
  data_ptr_t pdVar11;
  data_ptr_t pdVar12;
  data_ptr_t pdVar13;
  idx_t iVar14;
  type pSVar15;
  type this_01;
  reference pvVar16;
  pointer pRVar17;
  pointer pSVar18;
  ulong uVar19;
  idx_t iVar20;
  idx_t iVar21;
  idx_t *this_02;
  size_t __n_00;
  size_type sVar22;
  ulong uVar23;
  MergeSorter *pMVar24;
  idx_t copied;
  data_ptr_t result_ptr;
  ulong *local_d8;
  data_ptr_t r_ptr;
  data_ptr_t l_ptr;
  unique_ptr<duckdb::SBScanState,_std::default_delete<duckdb::SBScanState>,_true> *local_c0;
  MergeSorter *local_b8;
  idx_t local_b0;
  SortedBlock *local_a8;
  unique_ptr<duckdb::SBScanState,_std::default_delete<duckdb::SBScanState>,_true> *local_a0;
  optional_ptr<duckdb::FileBuffer,_true> *local_98;
  optional_ptr<duckdb::FileBuffer,_true> *local_90;
  bool *local_88;
  idx_t local_80;
  idx_t local_78;
  BufferHandle result_handle;
  
  local_c0 = &this->left;
  local_88 = left_smaller;
  pSVar15 = unique_ptr<duckdb::SBScanState,_std::default_delete<duckdb::SBScanState>,_true>::
            operator*(local_c0);
  local_a0 = &this->right;
  this_01 = unique_ptr<duckdb::SBScanState,_std::default_delete<duckdb::SBScanState>,_true>::
            operator*(local_a0);
  iVar7 = pSVar15->block_idx;
  iVar8 = pSVar15->entry_idx;
  iVar9 = this_01->block_idx;
  iVar10 = this_01->entry_idx;
  this_00 = pSVar15->sb;
  pSVar1 = this_01->sb;
  pvVar16 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
            ::back(&this->result->radix_sorting_data);
  target_block._M_head_impl =
       (pvVar16->super_unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>_>)
       ._M_t.super___uniq_ptr_impl<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::RowDataBlock_*,_std::default_delete<duckdb::RowDataBlock>_>.
       super__Head_base<0UL,_duckdb::RowDataBlock_*,_false>._M_head_impl;
  (*this->buffer_manager->_vptr_BufferManager[7])
            (&result_handle,this->buffer_manager,target_block._M_head_impl);
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&result_handle.node);
  result_ptr = (result_handle.node.ptr)->buffer +
               this->sort_layout->entry_size * (target_block._M_head_impl)->count;
  copied = 0;
  local_d8 = count;
  if (*count != 0) {
    l_entry_idx = &pSVar15->entry_idx;
    r_entry_idx = &this_01->entry_idx;
    local_90 = &(pSVar15->radix_handle).node;
    local_98 = &(this_01->radix_handle).node;
    local_b0 = 0;
    local_b8 = this;
    local_a8 = pSVar1;
    do {
      pSVar1 = local_a8;
      pMVar24 = local_b8;
      copied = local_b0;
      if (pSVar15->block_idx <
          (ulong)((long)(this_00->radix_sorting_data).
                        super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                        .
                        super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this_00->radix_sorting_data).
                        super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                        .
                        super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3)) {
        iVar2 = *l_entry_idx;
        pvVar16 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
                  ::operator[](&this_00->radix_sorting_data,pSVar15->block_idx);
        pRVar17 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>
                  ::operator->(pvVar16);
        if (iVar2 == pRVar17->count) {
          pvVar16 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
                    ::operator[](&this_00->radix_sorting_data,pSVar15->block_idx);
          pRVar17 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>
                    ::operator->(pvVar16);
          p_Var3 = (pRVar17->block).internal.
                   super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi;
          (pRVar17->block).internal.
          super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          (pRVar17->block).internal.
          super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
          }
          pSVar15->block_idx = pSVar15->block_idx + 1;
          pSVar15->entry_idx = 0;
        }
      }
      if (this_01->block_idx <
          (ulong)((long)(pSVar1->radix_sorting_data).
                        super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                        .
                        super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(pSVar1->radix_sorting_data).
                        super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                        .
                        super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3)) {
        iVar2 = *r_entry_idx;
        pvVar16 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
                  ::operator[](&pSVar1->radix_sorting_data,this_01->block_idx);
        pRVar17 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>
                  ::operator->(pvVar16);
        if (iVar2 == pRVar17->count) {
          pvVar16 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
                    ::operator[](&pSVar1->radix_sorting_data,this_01->block_idx);
          pRVar17 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>
                    ::operator->(pvVar16);
          p_Var3 = (pRVar17->block).internal.
                   super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi;
          (pRVar17->block).internal.
          super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          (pRVar17->block).internal.
          super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
          }
          this_01->block_idx = this_01->block_idx + 1;
          this_01->entry_idx = 0;
        }
      }
      __n = pSVar15->block_idx;
      sVar22 = (long)(this_00->radix_sorting_data).
                     super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                     .
                     super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this_00->radix_sorting_data).
                     super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                     .
                     super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3;
      puVar4 = (pSVar1->radix_sorting_data).
               super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      puVar5 = (pSVar1->radix_sorting_data).
               super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      iVar2 = this_01->block_idx;
      if (__n == sVar22) {
        iVar20 = 0;
      }
      else {
        pvVar16 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
                  ::operator[](&this_00->radix_sorting_data,__n);
        _Var6._M_head_impl =
             (pvVar16->
             super_unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>_>).
             _M_t.
             super___uniq_ptr_impl<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::RowDataBlock_*,_std::default_delete<duckdb::RowDataBlock>_>
             .super__Head_base<0UL,_duckdb::RowDataBlock_*,_false>._M_head_impl;
        pSVar18 = unique_ptr<duckdb::SBScanState,_std::default_delete<duckdb::SBScanState>,_true>::
                  operator->(local_c0);
        SBScanState::PinRadix(pSVar18,pSVar15->block_idx);
        optional_ptr<duckdb::FileBuffer,_true>::CheckValid(local_90);
        l_ptr = ((pSVar15->radix_handle).node.ptr)->buffer +
                pSVar15->sort_layout->entry_size * pSVar15->entry_idx;
        iVar20 = (_Var6._M_head_impl)->count;
      }
      iVar21 = (long)puVar4 - (long)puVar5 >> 3;
      local_78 = iVar20;
      if (iVar2 == iVar21) {
        local_80 = 0;
      }
      else {
        pvVar16 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
                  ::operator[](&local_a8->radix_sorting_data,this_01->block_idx);
        _Var6._M_head_impl =
             (pvVar16->
             super_unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>_>).
             _M_t.
             super___uniq_ptr_impl<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::RowDataBlock_*,_std::default_delete<duckdb::RowDataBlock>_>
             .super__Head_base<0UL,_duckdb::RowDataBlock_*,_false>._M_head_impl;
        SBScanState::PinRadix(this_01,this_01->block_idx);
        optional_ptr<duckdb::FileBuffer,_true>::CheckValid(local_98);
        r_ptr = ((this_01->radix_handle).node.ptr)->buffer +
                this_01->sort_layout->entry_size * this_01->entry_idx;
        local_80 = (_Var6._M_head_impl)->count;
        pMVar24 = local_b8;
      }
      iVar14 = local_b0;
      pdVar13 = l_ptr;
      pdVar12 = r_ptr;
      pdVar11 = result_ptr;
      this_02 = &pMVar24->sort_layout->entry_size;
      if ((__n == sVar22) || (iVar2 == iVar21)) {
        uVar19 = *local_d8 - local_b0;
        if (iVar2 == iVar21) {
          uVar23 = (target_block._M_head_impl)->capacity - (target_block._M_head_impl)->count;
          if (uVar19 < uVar23) {
            uVar23 = uVar19;
          }
          if (iVar20 - *l_entry_idx <= uVar23) {
            uVar23 = iVar20 - *l_entry_idx;
          }
          __n_00 = *this_02 * uVar23;
          switchD_012dd528::default(result_ptr,l_ptr,__n_00);
          l_ptr = pdVar13 + __n_00;
          *l_entry_idx = *l_entry_idx + uVar23;
          (target_block._M_head_impl)->count = (target_block._M_head_impl)->count + uVar23;
        }
        else {
          uVar23 = (target_block._M_head_impl)->capacity - (target_block._M_head_impl)->count;
          if (uVar19 < uVar23) {
            uVar23 = uVar19;
          }
          if (local_80 - *r_entry_idx <= uVar23) {
            uVar23 = local_80 - *r_entry_idx;
          }
          __n_00 = *this_02 * uVar23;
          switchD_012dd528::default(result_ptr,r_ptr,__n_00);
          r_ptr = pdVar12 + __n_00;
          *r_entry_idx = *r_entry_idx + uVar23;
          (target_block._M_head_impl)->count = (target_block._M_head_impl)->count + uVar23;
        }
        result_ptr = pdVar11 + __n_00;
        copied = iVar14 + uVar23;
      }
      else {
        MergeRows((MergeSorter *)this_02,&l_ptr,l_entry_idx,&local_78,&r_ptr,r_entry_idx,&local_80,
                  target_block._M_head_impl,&result_ptr,this_02,local_88,&copied,local_d8);
      }
      local_b0 = copied;
    } while (copied < *local_d8);
  }
  pSVar18 = unique_ptr<duckdb::SBScanState,_std::default_delete<duckdb::SBScanState>,_true>::
            operator->(local_c0);
  pSVar18->block_idx = iVar7;
  pSVar18->entry_idx = iVar8;
  pSVar18 = unique_ptr<duckdb::SBScanState,_std::default_delete<duckdb::SBScanState>,_true>::
            operator->(local_a0);
  pSVar18->block_idx = iVar9;
  pSVar18->entry_idx = iVar10;
  BufferHandle::~BufferHandle(&result_handle);
  return;
}

Assistant:

void MergeSorter::MergeRadix(const idx_t &count, const bool left_smaller[]) {
	auto &l = *left;
	auto &r = *right;
	// Save indices to restore afterwards
	idx_t l_block_idx_before = l.block_idx;
	idx_t l_entry_idx_before = l.entry_idx;
	idx_t r_block_idx_before = r.block_idx;
	idx_t r_entry_idx_before = r.entry_idx;

	auto &l_blocks = l.sb->radix_sorting_data;
	auto &r_blocks = r.sb->radix_sorting_data;
	RowDataBlock *l_block = nullptr;
	RowDataBlock *r_block = nullptr;

	data_ptr_t l_ptr;
	data_ptr_t r_ptr;

	RowDataBlock *result_block = result->radix_sorting_data.back().get();
	auto result_handle = buffer_manager.Pin(result_block->block);
	data_ptr_t result_ptr = result_handle.Ptr() + result_block->count * sort_layout.entry_size;

	idx_t copied = 0;
	while (copied < count) {
		// Move to the next block (if needed)
		if (l.block_idx < l_blocks.size() && l.entry_idx == l_blocks[l.block_idx]->count) {
			// Delete reference to previous block
			l_blocks[l.block_idx]->block = nullptr;
			// Advance block
			l.block_idx++;
			l.entry_idx = 0;
		}
		if (r.block_idx < r_blocks.size() && r.entry_idx == r_blocks[r.block_idx]->count) {
			// Delete reference to previous block
			r_blocks[r.block_idx]->block = nullptr;
			// Advance block
			r.block_idx++;
			r.entry_idx = 0;
		}
		const bool l_done = l.block_idx == l_blocks.size();
		const bool r_done = r.block_idx == r_blocks.size();
		// Pin the radix sortable blocks
		idx_t l_count;
		if (!l_done) {
			l_block = l_blocks[l.block_idx].get();
			left->PinRadix(l.block_idx);
			l_ptr = l.RadixPtr();
			l_count = l_block->count;
		} else {
			l_count = 0;
		}
		idx_t r_count;
		if (!r_done) {
			r_block = r_blocks[r.block_idx].get();
			r.PinRadix(r.block_idx);
			r_ptr = r.RadixPtr();
			r_count = r_block->count;
		} else {
			r_count = 0;
		}
		// Copy using computed merge
		if (!l_done && !r_done) {
			// Both sides have data - merge
			MergeRows(l_ptr, l.entry_idx, l_count, r_ptr, r.entry_idx, r_count, *result_block, result_ptr,
			          sort_layout.entry_size, left_smaller, copied, count);
		} else if (r_done) {
			// Right side is exhausted
			FlushRows(l_ptr, l.entry_idx, l_count, *result_block, result_ptr, sort_layout.entry_size, copied, count);
		} else {
			// Left side is exhausted
			FlushRows(r_ptr, r.entry_idx, r_count, *result_block, result_ptr, sort_layout.entry_size, copied, count);
		}
	}
	// Reset block indices
	left->SetIndices(l_block_idx_before, l_entry_idx_before);
	right->SetIndices(r_block_idx_before, r_entry_idx_before);
}